

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O0

void TasGrid::writeNodeDataList<false>
               (forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *data,
               ostream *os)

{
  NodeData *x;
  pointer os_00;
  bool bVar1;
  size_type sVar2;
  reference ppNVar3;
  NodeData *d;
  iterator __end2;
  iterator __begin2;
  vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> *__range2;
  undefined1 local_30 [8];
  vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> data_refs;
  ostream *os_local;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *data_local;
  
  data_refs.
  super__Vector_base<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)os;
  ::std::ostream::operator<<(os,::std::scientific);
  ::std::ios_base::precision
            ((ios_base *)
             ((long)data_refs.
                    super__Vector_base<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage +
             (long)(*data_refs.
                     super__Vector_base<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)[-1].value.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start),0x11);
  makeReverseReferenceVector<TasGrid::NodeData>
            ((vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> *)
             local_30,data);
  os_00 = data_refs.
          super__Vector_base<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar2 = ::std::vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>::size
                    ((vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>
                      *)local_30);
  IO::writeNumbers<false,(TasGrid::IO::IOPad)3,int>((ostream *)os_00,(int)sVar2);
  __end2 = ::std::vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>::
           begin((vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> *)
                 local_30);
  d = (NodeData *)
      ::std::vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>::end
                ((vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> *)
                 local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_TasGrid::NodeData_**,_std::vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>_>
                                *)&d);
    if (!bVar1) break;
    ppNVar3 = __gnu_cxx::
              __normal_iterator<const_TasGrid::NodeData_**,_std::vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>_>
              ::operator*(&__end2);
    x = *ppNVar3;
    IO::writeVector<false,(TasGrid::IO::IOPad)1,int>
              (&x->point,
               (ostream *)
               data_refs.
               super__Vector_base<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    IO::writeVector<false,(TasGrid::IO::IOPad)3,double>
              (&x->value,
               (ostream *)
               data_refs.
               super__Vector_base<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_TasGrid::NodeData_**,_std::vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>_>
    ::operator++(&__end2);
  }
  ::std::vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_>::~vector
            ((vector<const_TasGrid::NodeData_*,_std::allocator<const_TasGrid::NodeData_*>_> *)
             local_30);
  return;
}

Assistant:

void writeNodeDataList(const std::forward_list<NodeData> &data, std::ostream &os){
    if (use_ascii == mode_ascii){ os << std::scientific; os.precision(17); }

    auto data_refs = makeReverseReferenceVector(data);

    IO::writeNumbers<use_ascii, IO::pad_line>(os, static_cast<int>(data_refs.size()));
    for(auto d : data_refs){
        IO::writeVector<use_ascii, IO::pad_rspace>(d->point, os);
        IO::writeVector<use_ascii, IO::pad_line>(d->value, os);
    }
}